

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> * __thiscall
RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
::get_remainder(basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                *__return_storage_ptr__,
               RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
               *this,size_t in_times_split)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  iterator __end;
  __normal_iterator<signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  local_50;
  __normal_iterator<signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  local_48;
  __normal_iterator<signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  local_40;
  const_iterator local_38;
  value_type local_30;
  value_type index;
  ulong local_20;
  size_t in_times_split_local;
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  *this_local;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> *result;
  
  index._7_1_ = 0;
  local_20 = in_times_split;
  in_times_split_local = (size_t)this;
  this_local = (RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                *)__return_storage_ptr__;
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  basic_string(__return_storage_ptr__);
  uVar1 = local_20;
  sVar2 = std::
          vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
          ::size(&this->m_tokens);
  if (uVar1 < sVar2) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_token_indexes,local_20);
    local_30 = *pvVar3;
    local_40._M_current =
         (char *)std::__cxx11::
                 basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                 ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
    ::__normal_iterator<signed_char*>
              ((__normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
                *)&local_38,&local_40);
    local_50._M_current =
         (char *)std::__cxx11::
                 basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                 ::begin(&this->m_str);
    local_48 = __gnu_cxx::
               __normal_iterator<signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
               ::operator+(&local_50,local_30);
    __end = std::__cxx11::
            basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
            end(&this->m_str);
    std::__cxx11::
    basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>::
    insert<__gnu_cxx::__normal_iterator<signed_char*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>,void>
              ((basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>
                *)__return_storage_ptr__,local_38,local_48,
               (__normal_iterator<signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                )__end._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		if (in_times_split < m_tokens.size()) {
			auto index = m_token_indexes[in_times_split];
			result.insert(result.end(), m_str.begin() + index, m_str.end());
		}

		return result;
	}